

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_pyr.h
# Opt level: O2

void vo::ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_>::subsample
               (Image<const_unsigned_short> *img,Image<unsigned_short> *img_sub)

{
  size_t sVar1;
  unsigned_short *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  unsigned_short *puVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  undefined2 *puVar20;
  int iVar21;
  int *piVar22;
  long local_98;
  ManagedImage<int,_std::allocator<int>_> tmp;
  
  ManagedImage<int,_std::allocator<int>_>::ManagedImage(&tmp,img_sub->h,img->w);
  uVar18 = (uint)img_sub->h;
  sVar1 = img->pitch;
  puVar2 = img->ptr;
  uVar10 = (uint)img->w;
  uVar13 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar13 = 0;
  }
  iVar16 = (int)img->h;
  local_98 = 0;
  uVar5 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar5 = 0;
  }
  iVar19 = iVar16 + -1;
  iVar9 = iVar16 + -3;
  iVar11 = 3 - iVar16;
  uVar18 = 2;
  iVar21 = -iVar16;
  uVar10 = 0xffffffff;
  uVar15 = 1;
  uVar17 = 0xfffffffe;
  uVar8 = 0;
  puVar12 = puVar2;
  while( true ) {
    iVar21 = iVar21 + 2;
    iVar16 = iVar16 + -2;
    lVar14 = (long)iVar11;
    if ((long)iVar11 < (long)iVar9) {
      lVar14 = (long)iVar9;
    }
    lVar7 = (long)iVar21;
    if ((long)iVar21 < (long)iVar16) {
      lVar7 = (long)iVar16;
    }
    uVar3 = uVar15;
    if ((int)uVar15 < (int)uVar10) {
      uVar3 = uVar10;
    }
    uVar4 = uVar18;
    if ((int)uVar18 < (int)uVar17) {
      uVar4 = uVar17;
    }
    if (uVar8 == uVar5) break;
    piVar22 = (int *)((long)tmp.super_Image<int>.ptr + local_98);
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      *piVar22 = (uint)puVar12[uVar6] * 6 +
                 (uint)*(ushort *)((long)puVar2 + uVar6 * 2 + (iVar19 - lVar14) * sVar1) +
                 (uint)*(ushort *)((long)puVar2 + uVar6 * 2 + uVar4 * sVar1) +
                 ((uint)*(ushort *)((long)puVar2 + uVar6 * 2 + (iVar19 - lVar7) * sVar1) +
                 (uint)*(ushort *)((long)puVar2 + uVar6 * 2 + uVar3 * sVar1)) * 4;
      piVar22 = (int *)((long)piVar22 + tmp.super_Image<int>.pitch);
    }
    uVar8 = uVar8 + 1;
    iVar9 = iVar9 + -2;
    iVar11 = iVar11 + 2;
    puVar12 = puVar12 + sVar1;
    uVar10 = uVar10 + 2;
    uVar15 = uVar15 - 2;
    uVar17 = uVar17 + 2;
    uVar18 = uVar18 - 2;
    local_98 = local_98 + 4;
  }
  uVar18 = (uint)img_sub->w;
  iVar16 = (int)tmp.super_Image<int>.h + -1;
  uVar13 = (ulong)(uint)tmp.super_Image<int>.w;
  if ((int)(uint)tmp.super_Image<int>.w < 1) {
    uVar13 = 0;
  }
  local_98 = 0;
  uVar5 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar5 = 0;
  }
  iVar19 = (int)tmp.super_Image<int>.h + -3;
  iVar21 = 3 - (int)tmp.super_Image<int>.h;
  uVar18 = 2;
  iVar9 = -(int)tmp.super_Image<int>.h;
  uVar10 = 0xffffffff;
  uVar15 = 1;
  uVar17 = 0xfffffffe;
  uVar8 = 0;
  piVar22 = tmp.super_Image<int>.ptr;
  while( true ) {
    iVar9 = iVar9 + 2;
    tmp.super_Image<int>.h._0_4_ = (int)tmp.super_Image<int>.h + -2;
    lVar14 = (long)iVar21;
    if ((long)iVar21 < (long)iVar19) {
      lVar14 = (long)iVar19;
    }
    lVar7 = (long)iVar9;
    if ((long)iVar9 < (long)(int)tmp.super_Image<int>.h) {
      lVar7 = (long)(int)tmp.super_Image<int>.h;
    }
    uVar3 = uVar15;
    if ((int)uVar15 < (int)uVar10) {
      uVar3 = uVar10;
    }
    uVar4 = uVar18;
    if ((int)uVar18 < (int)uVar17) {
      uVar4 = uVar17;
    }
    if (uVar8 == uVar5) break;
    sVar1 = img_sub->pitch;
    puVar20 = (undefined2 *)((long)img_sub->ptr + local_98);
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      *puVar20 = (short)((uint)(piVar22[uVar6] * 6 +
                                *(int *)((long)tmp.super_Image<int>.ptr +
                                        uVar6 * 4 + uVar4 * tmp.super_Image<int>.pitch) +
                                *(int *)((long)tmp.super_Image<int>.ptr +
                                        uVar6 * 4 + (iVar16 - lVar14) * tmp.super_Image<int>.pitch)
                                + (*(int *)((long)tmp.super_Image<int>.ptr +
                                           uVar6 * 4 + (iVar16 - lVar7) * tmp.super_Image<int>.pitch
                                           ) +
                                  *(int *)((long)tmp.super_Image<int>.ptr +
                                          uVar6 * 4 + uVar3 * tmp.super_Image<int>.pitch)) * 4 +
                               0x80) >> 8);
      puVar20 = (undefined2 *)((long)puVar20 + sVar1);
    }
    uVar8 = uVar8 + 1;
    iVar19 = iVar19 + -2;
    iVar21 = iVar21 + 2;
    piVar22 = (int *)((long)piVar22 + tmp.super_Image<int>.pitch * 2);
    uVar10 = uVar10 + 2;
    uVar15 = uVar15 - 2;
    uVar17 = uVar17 + 2;
    uVar18 = uVar18 - 2;
    local_98 = local_98 + 2;
  }
  ManagedImage<int,_std::allocator<int>_>::~ManagedImage(&tmp);
  return;
}

Assistant:

static void subsample(const Image<const T>& img, Image<T>& img_sub) {
    static_assert(std::is_same<T, uint16_t>::value ||
                  std::is_same<T, uint8_t>::value);

    constexpr int kernel[5] = {1, 4, 6, 4, 1};

    // accumulator
    ManagedImage<int> tmp(img_sub.h, img.w);

    // Vertical convolution
    {
      for (int r = 0; r < int(img_sub.h); r++) {
        const T* row_m2 = img.RowPtr(std::abs(2 * r - 2));
        const T* row_m1 = img.RowPtr(std::abs(2 * r - 1));
        const T* row = img.RowPtr(2 * r);
        const T* row_p1 = img.RowPtr(border101(2 * r + 1, img.h));
        const T* row_p2 = img.RowPtr(border101(2 * r + 2, img.h));

        for (int c = 0; c < int(img.w); c++) {
          tmp(r, c) = kernel[0] * int(row_m2[c]) + kernel[1] * int(row_m1[c]) +
                      kernel[2] * int(row[c]) + kernel[3] * int(row_p1[c]) +
                      kernel[4] * int(row_p2[c]);
        }
      }
    }

    // Horizontal convolution
    {
      for (int c = 0; c < int(img_sub.w); c++) {
        const int* row_m2 = tmp.RowPtr(std::abs(2 * c - 2));
        const int* row_m1 = tmp.RowPtr(std::abs(2 * c - 1));
        const int* row = tmp.RowPtr(2 * c);
        const int* row_p1 = tmp.RowPtr(border101(2 * c + 1, tmp.h));
        const int* row_p2 = tmp.RowPtr(border101(2 * c + 2, tmp.h));

        for (int r = 0; r < int(tmp.w); r++) {
          int val_int = kernel[0] * row_m2[r] + kernel[1] * row_m1[r] +
                        kernel[2] * row[r] + kernel[3] * row_p1[r] +
                        kernel[4] * row_p2[r];
          T val = ((val_int + (1 << 7)) >> 8);
          img_sub(c, r) = val;
        }
      }
    }
  }